

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void deqp::gls::calcShaderColorCoord<float>
               (Vec2 *coord,Vec3 *color,Vector<float,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  undefined7 in_register_00000009;
  float fVar1;
  undefined8 local_1c;
  float local_14;
  
  if ((int)CONCAT71(in_register_00000009,isCoordinate) == 0) {
    switch(numComponents + -1) {
    case 0:
      tcu::operator*((tcu *)&local_1c,attribValue->m_data[0],color);
      color->m_data[2] = local_14;
      *(undefined8 *)color->m_data = local_1c;
      return;
    case 1:
      fVar1 = color->m_data[1];
      color->m_data[0] = color->m_data[0] * attribValue->m_data[0];
      color->m_data[1] = fVar1 * attribValue->m_data[1];
      return;
    case 2:
      fVar1 = color->m_data[1];
      color->m_data[0] = color->m_data[0] * attribValue->m_data[0];
      color->m_data[1] = fVar1 * attribValue->m_data[1];
      fVar1 = color->m_data[2] * attribValue->m_data[2];
      break;
    case 3:
      fVar1 = color->m_data[1];
      color->m_data[0] = color->m_data[0] * attribValue->m_data[0] * attribValue->m_data[3];
      color->m_data[1] = fVar1 * attribValue->m_data[1] * attribValue->m_data[3];
      fVar1 = color->m_data[2] * attribValue->m_data[2] * attribValue->m_data[3];
      break;
    default:
      goto switchD_00460c92_default;
    }
    color->m_data[2] = fVar1;
    return;
  }
  switch(numComponents + -1) {
  case 0:
    fVar1 = attribValue->m_data[0];
    coord->m_data[0] = fVar1;
    break;
  case 1:
    *(undefined8 *)coord->m_data = *(undefined8 *)attribValue->m_data;
    return;
  case 2:
    fVar1 = attribValue->m_data[1];
    coord->m_data[0] = attribValue->m_data[0] + attribValue->m_data[2];
    break;
  case 3:
    *(ulong *)coord->m_data =
         CONCAT44((float)((ulong)*(undefined8 *)(attribValue->m_data + 2) >> 0x20) +
                  (float)((ulong)*(undefined8 *)attribValue->m_data >> 0x20),
                  (float)*(undefined8 *)(attribValue->m_data + 2) +
                  (float)*(undefined8 *)attribValue->m_data);
    return;
  default:
    goto switchD_00460c92_default;
  }
  coord->m_data[1] = fVar1;
switchD_00460c92_default:
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}